

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O3

Value * duckdb::AggregateFunctionExtractor::GetVarArgs
                  (Value *__return_storage_ptr__,AggregateFunctionCatalogEntry *entry,idx_t offset)

{
  bool bVar1;
  AggregateFunction fun;
  LogicalType LStack_178;
  string local_160;
  AggregateFunction local_140;
  
  FunctionSet<duckdb::AggregateFunction>::GetFunctionByOffset
            (&local_140,&(entry->functions).super_FunctionSet<duckdb::AggregateFunction>,offset);
  bVar1 = SimpleFunction::HasVarArgs((SimpleFunction *)&local_140);
  if (bVar1) {
    LogicalType::ToString_abi_cxx11_
              (&local_160,&local_140.super_BaseScalarFunction.super_SimpleFunction.varargs);
    Value::Value(__return_storage_ptr__,&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p);
    }
  }
  else {
    LogicalType::LogicalType(&LStack_178,SQLNULL);
    Value::Value(__return_storage_ptr__,&LStack_178);
    LogicalType::~LogicalType(&LStack_178);
  }
  local_140.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_01966bf8;
  if (local_140.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_140.function_info.internal.
               super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_140.super_BaseScalarFunction);
  return __return_storage_ptr__;
}

Assistant:

static Value GetVarArgs(AggregateFunctionCatalogEntry &entry, idx_t offset) {
		auto fun = entry.functions.GetFunctionByOffset(offset);
		return !fun.HasVarArgs() ? Value() : Value(fun.varargs.ToString());
	}